

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O1

QString * __thiscall
QString::section(QString *__return_storage_ptr__,QString *this,QString *sep,qsizetype start,
                qsizetype end,SectionFlags flags)

{
  char16_t *b;
  long lVar1;
  QChar *pQVar2;
  QStringView sep_00;
  QStringView *pQVar3;
  qsizetype qVar4;
  undefined1 *puVar5;
  QChar *unicode;
  long lVar6;
  long lVar7;
  undefined1 *puVar8;
  undefined1 *puVar9;
  undefined1 *puVar10;
  undefined1 *puVar11;
  undefined1 *puVar12;
  long in_FS_OFFSET;
  QString *ret;
  QStringView local_68;
  QList<QStringView> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d.ptr = (QStringView *)&DAT_aaaaaaaaaaaaaaaa;
  local_68.m_data = (this->d).ptr;
  local_68.m_size = (this->d).size;
  sep_00.m_data = (sep->d).ptr;
  sep_00.m_size = (sep->d).size;
  QStringView::split(&local_58,&local_68,sep_00,(SplitBehavior)0x0,
                     (uint)(((uint)flags.super_QFlagsStorageHelper<QString::SectionFlag,_4>.
                                   super_QFlagsStorage<QString::SectionFlag>.i & 8) == 0));
  qVar4 = local_58.d.size;
  puVar8 = (undefined1 *)local_58.d.size;
  if (((uint)flags.super_QFlagsStorageHelper<QString::SectionFlag,_4>.
             super_QFlagsStorage<QString::SectionFlag>.i & 1) != 0) {
    if ((undefined1 *)local_58.d.size == (undefined1 *)0x0) {
      lVar6 = 0;
    }
    else {
      lVar7 = 0;
      lVar6 = 0;
      do {
        lVar6 = lVar6 + (ulong)(*(long *)((long)&(local_58.d.ptr)->m_size + lVar7) == 0);
        lVar7 = lVar7 + 0x10;
      } while (local_58.d.size << 4 != lVar7);
    }
    puVar8 = (undefined1 *)(local_58.d.size + -lVar6);
  }
  puVar5 = (undefined1 *)((start >> 0x3f & (ulong)puVar8) + start);
  if ((((long)puVar5 < local_58.d.size) &&
      (puVar8 = (undefined1 *)((end >> 0x3f & (ulong)puVar8) + end), -1 < (long)puVar8)) &&
     ((long)puVar5 <= (long)puVar8)) {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
    puVar9 = puVar5;
    puVar12 = puVar8;
    if ((undefined1 *)local_58.d.size != (undefined1 *)0x0) {
      lVar6 = 8;
      puVar10 = (undefined1 *)0x0;
      puVar11 = (undefined1 *)0x0;
      do {
        pQVar3 = local_58.d.ptr;
        lVar7 = *(long *)((long)&(local_58.d.ptr)->m_data + lVar6);
        if ((long)puVar5 <= (long)puVar11) {
          if (puVar11 == puVar8) {
            puVar12 = puVar10;
          }
          if (puVar11 == puVar5) {
            puVar9 = puVar10;
          }
          if (puVar10 != (undefined1 *)0x0 && (long)puVar5 < (long)puVar11) {
            append(__return_storage_ptr__,sep);
          }
          b = *(char16_t **)((long)pQVar3 + lVar6 + -8);
          lVar1 = *(long *)((long)&pQVar3->m_data + lVar6);
          if (0 < lVar1 && b != (char16_t *)0x0) {
            QtPrivate::QCommonArrayOps<char16_t>::growAppend
                      ((QCommonArrayOps<char16_t> *)__return_storage_ptr__,b,b + lVar1);
            (__return_storage_ptr__->d).ptr[(__return_storage_ptr__->d).size] = L'\0';
          }
        }
        puVar11 = puVar11 + (((uint)flags.super_QFlagsStorageHelper<QString::SectionFlag,_4>.
                                    super_QFlagsStorage<QString::SectionFlag>.i & 1) == 0 ||
                            lVar7 != 0);
        if ((long)puVar8 < (long)puVar11) break;
        puVar10 = puVar10 + 1;
        lVar6 = lVar6 + 0x10;
      } while (puVar10 < (ulong)qVar4);
    }
    if ((((uint)flags.super_QFlagsStorageHelper<QString::SectionFlag,_4>.
                super_QFlagsStorage<QString::SectionFlag>.i & 2) != 0) && (0 < (long)puVar9)) {
      pQVar2 = (QChar *)(sep->d).ptr;
      unicode = (QChar *)L"";
      if (pQVar2 != (QChar *)0x0) {
        unicode = pQVar2;
      }
      insert(__return_storage_ptr__,0,unicode,(sep->d).size);
    }
    if ((((uint)flags.super_QFlagsStorageHelper<QString::SectionFlag,_4>.
                super_QFlagsStorage<QString::SectionFlag>.i & 4) != 0) &&
       ((long)puVar12 < (long)(qVar4 + -1))) {
      append(__return_storage_ptr__,sep);
    }
  }
  else {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,0x10,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QString QString::section(const QString &sep, qsizetype start, qsizetype end, SectionFlags flags) const
{
    const QList<QStringView> sections = QStringView{ *this }.split(
            sep, Qt::KeepEmptyParts, (flags & SectionCaseInsensitiveSeps) ? Qt::CaseInsensitive : Qt::CaseSensitive);
    const qsizetype sectionsSize = sections.size();
    if (!(flags & SectionSkipEmpty)) {
        if (start < 0)
            start += sectionsSize;
        if (end < 0)
            end += sectionsSize;
    } else {
        qsizetype skip = 0;
        for (qsizetype k = 0; k < sectionsSize; ++k) {
            if (sections.at(k).isEmpty())
                skip++;
        }
        if (start < 0)
            start += sectionsSize - skip;
        if (end < 0)
            end += sectionsSize - skip;
    }
    if (start >= sectionsSize || end < 0 || start > end)
        return QString();

    QString ret;
    qsizetype first_i = start, last_i = end;
    for (qsizetype x = 0, i = 0; x <= end && i < sectionsSize; ++i) {
        const QStringView &section = sections.at(i);
        const bool empty = section.isEmpty();
        if (x >= start) {
            if (x == start)
                first_i = i;
            if (x == end)
                last_i = i;
            if (x > start && i > 0)
                ret += sep;
            ret += section;
        }
        if (!empty || !(flags & SectionSkipEmpty))
            x++;
    }
    if ((flags & SectionIncludeLeadingSep) && first_i > 0)
        ret.prepend(sep);
    if ((flags & SectionIncludeTrailingSep) && last_i < sectionsSize - 1)
        ret += sep;
    return ret;
}